

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O2

value scope_metadata(scope sp)

{
  char *__s;
  value v;
  value *ppvVar1;
  value pvVar2;
  value *ppvVar3;
  value pvVar4;
  size_t length;
  value v_00;
  value pvVar5;
  value pvVar6;
  value *local_68;
  value *ppvStack_60;
  value *local_58;
  size_t sStack_50;
  size_t local_48;
  size_t sStack_40;
  
  v = value_create_map((value *)0x0,4);
  if (v != (value)0x0) {
    ppvVar1 = value_to_map(v);
    pvVar2 = value_create_array((value *)0x0,2);
    if (pvVar2 == (value)0x0) {
      *ppvVar1 = (value)0x0;
    }
    else {
      ppvVar3 = value_to_array(pvVar2);
      pvVar4 = value_create_string("name",4);
      *ppvVar3 = pvVar4;
      if (pvVar4 == (value)0x0) {
        value_type_destroy(pvVar2);
      }
      __s = sp->name;
      length = strlen(__s);
      pvVar4 = value_create_string(__s,length);
      ppvVar3[1] = pvVar4;
      if (pvVar4 == (value)0x0) {
        value_type_destroy(pvVar2);
      }
      *ppvVar1 = pvVar2;
      local_48 = 0;
      sStack_40 = 0;
      local_58 = (value *)0x0;
      sStack_50 = 0;
      local_68 = (value *)0x0;
      ppvStack_60 = (value *)0x0;
      set_iterate(sp->objects,scope_metadata_array_cb_iterate_counter,&local_68);
      pvVar2 = value_create_array((value *)0x0,sStack_50);
      if (pvVar2 != (value)0x0) {
        local_68 = value_to_array(pvVar2);
        pvVar4 = value_create_array((value *)0x0,local_48);
        if (pvVar4 != (value)0x0) {
          ppvStack_60 = value_to_array(pvVar4);
          v_00 = value_create_array((value *)0x0,sStack_40);
          if (v_00 != (value)0x0) {
            local_58 = value_to_array(v_00);
            sStack_50 = 0;
            local_48 = 0;
            sStack_40 = 0;
            set_iterate(sp->objects,scope_metadata_array_cb_iterate,&local_68);
            pvVar5 = value_create_array((value *)0x0,2);
            ppvVar3 = value_to_array(pvVar5);
            pvVar6 = value_create_string("funcs",5);
            *ppvVar3 = pvVar6;
            ppvVar3[1] = pvVar2;
            ppvVar1[1] = pvVar5;
            pvVar2 = value_create_array((value *)0x0,2);
            ppvVar3 = value_to_array(pvVar2);
            pvVar5 = value_create_string("classes",7);
            *ppvVar3 = pvVar5;
            ppvVar3[1] = pvVar4;
            ppvVar1[2] = pvVar2;
            pvVar2 = value_create_array((value *)0x0,2);
            ppvVar3 = value_to_array(pvVar2);
            pvVar4 = value_create_string("objects",7);
            *ppvVar3 = pvVar4;
            ppvVar3[1] = v_00;
            ppvVar1[3] = pvVar2;
            return v;
          }
          value_destroy(pvVar2);
          pvVar2 = pvVar4;
        }
        value_destroy(pvVar2);
      }
    }
    value_type_destroy(v);
  }
  return (value)0x0;
}

Assistant:

value scope_metadata(scope sp)
{
	value *v_map, v = value_create_map(NULL, 4);
	value v_array[3] = { NULL, NULL, NULL }; // 0: funcs, 1: cls, 2: obj

	if (v == NULL)
	{
		return NULL;
	}

	v_map = value_to_map(v);

	v_map[0] = scope_metadata_name(sp);

	if (v_map[0] == NULL)
	{
		value_type_destroy(v);
		return NULL;
	}

	/* Obtain all scope objects of each type (functions, classes and objects) */
	if (scope_metadata_array(sp, v_array) != 0)
	{
		value_type_destroy(v);
		return NULL;
	}

	/* Functions */
	static const char funcs[] = "funcs";
	value *v_funcs_ptr, v_funcs = value_create_array(NULL, 2);
	v_funcs_ptr = value_to_array(v_funcs);
	v_funcs_ptr[0] = value_create_string(funcs, sizeof(funcs) - 1);
	v_funcs_ptr[1] = v_array[0];
	v_map[1] = v_funcs;

	/* Classes */
	static const char classes[] = "classes";
	value *v_classes_ptr, v_classes = value_create_array(NULL, 2);
	v_classes_ptr = value_to_array(v_classes);
	v_classes_ptr[0] = value_create_string(classes, sizeof(classes) - 1);
	v_classes_ptr[1] = v_array[1];
	v_map[2] = v_classes;

	/* Objects */
	static const char objects[] = "objects";
	value *v_objects_ptr, v_objects = value_create_array(NULL, 2);
	v_objects_ptr = value_to_array(v_objects);
	v_objects_ptr[0] = value_create_string(objects, sizeof(objects) - 1);
	v_objects_ptr[1] = v_array[2];
	v_map[3] = v_objects;

	return v;
}